

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

sftp_zombie_requests * find_zombie_request(LIBSSH2_SFTP *sftp,uint32_t request_id)

{
  sftp_zombie_requests *node;
  
  for (node = (sftp_zombie_requests *)_libssh2_list_first(&sftp->zombie_requests);
      (node != (sftp_zombie_requests *)0x0 && (node->request_id != request_id));
      node = (sftp_zombie_requests *)_libssh2_list_next(&node->node)) {
  }
  return node;
}

Assistant:

static struct sftp_zombie_requests *
find_zombie_request(LIBSSH2_SFTP *sftp, uint32_t request_id)
{
    struct sftp_zombie_requests *zombie =
        _libssh2_list_first(&sftp->zombie_requests);

    while(zombie) {
        if(zombie->request_id == request_id)
            break;
        else
            zombie = _libssh2_list_next(&zombie->node);
    }

    return zombie;
}